

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_json_mapping_base.h
# Opt level: O1

vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
* __thiscall
cfd::core::
JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_ElementsDecodeRawTransactionTxInStruct>
::ConvertToStruct(vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
                  *__return_storage_ptr__,
                 JsonObjectVector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_ElementsDecodeRawTransactionTxInStruct>
                 *this)

{
  pointer pEVar1;
  pointer this_00;
  ElementsDecodeRawTransactionTxInStruct data;
  ElementsDecodeRawTransactionTxInStruct local_2b0;
  
  (__return_storage_ptr__->
  super__Vector_base<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (this->super_JsonVector<cfd::api::json::ElementsDecodeRawTransactionTxIn>).
            super_vector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>
            .
            super__Vector_base<cfd::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pEVar1 = (this->super_JsonVector<cfd::api::json::ElementsDecodeRawTransactionTxIn>).
           super_vector<cfd::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>
           .
           super__Vector_base<cfd::api::json::ElementsDecodeRawTransactionTxIn,_std::allocator<cfd::api::json::ElementsDecodeRawTransactionTxIn>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_00 != pEVar1) {
    do {
      cfd::api::json::ElementsDecodeRawTransactionTxIn::ConvertToStruct(&local_2b0,this_00);
      ::std::
      vector<ElementsDecodeRawTransactionTxInStruct,_std::allocator<ElementsDecodeRawTransactionTxInStruct>_>
      ::push_back(__return_storage_ptr__,&local_2b0);
      ElementsDecodeRawTransactionTxInStruct::~ElementsDecodeRawTransactionTxInStruct(&local_2b0);
      this_00 = this_00 + 1;
    } while (this_00 != pEVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<STRUCT_TYPE> ConvertToStruct() const {
    std::vector<STRUCT_TYPE> result;
    for (const auto& element : *this) {
      STRUCT_TYPE data = element.ConvertToStruct();
      result.push_back(data);
    }
    return result;
  }